

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# symtab.c
# Opt level: O2

int symtab_put(symtab *tab,char *cname,int type,int data)

{
  int iVar1;
  int iVar2;
  int iVar3;
  uint32_t uVar4;
  char *str;
  symtab_sym *__ptr;
  long lVar5;
  int *piVar6;
  ulong uVar7;
  int iVar8;
  uint uVar9;
  uint uVar10;
  ulong uVar11;
  
  iVar3 = symtab_get(tab,cname,(int *)0x0,(int *)0x0);
  if (iVar3 == -1) {
    str = strdup(cname);
    uVar4 = elf_hash(str);
    uVar9 = uVar4 % (uint)tab->bucketsnum;
    iVar3 = tab->symsnum;
    iVar1 = tab->buckets[(int)uVar9];
    tab->buckets[(int)uVar9] = iVar3;
    iVar2 = tab->symsmax;
    __ptr = tab->syms;
    iVar8 = iVar3;
    if (iVar2 <= iVar3) {
      iVar8 = 0x10;
      if (iVar2 != 0) {
        iVar8 = iVar2 * 2;
      }
      tab->symsmax = iVar8;
      __ptr = (symtab_sym *)realloc(__ptr,(long)iVar8 * 0x18);
      tab->syms = __ptr;
      iVar8 = tab->symsnum;
    }
    tab->symsnum = iVar8 + 1;
    __ptr[iVar8].name = str;
    __ptr[iVar8].hash = uVar4;
    __ptr[iVar8].hchain = iVar1;
    __ptr[iVar8].type = type;
    __ptr[iVar8].data = data;
    if (tab->bucketsnum != 0x10000000 && tab->bucketsnum < tab->symsnum) {
      free(tab->buckets);
      for (lVar5 = 0; (lVar5 != 0x2c && (*(int *)((long)primes + lVar5) < tab->symsnum));
          lVar5 = lVar5 + 4) {
      }
      uVar9 = *(uint *)((long)primes + lVar5);
      tab->bucketsnum = uVar9;
      piVar6 = (int *)malloc((long)(int)uVar9 << 2);
      tab->buckets = piVar6;
      uVar7 = 0;
      uVar11 = 0;
      if (0 < (int)uVar9) {
        uVar11 = (ulong)uVar9;
      }
      for (; uVar11 != uVar7; uVar7 = uVar7 + 1) {
        piVar6[uVar7] = -1;
      }
      uVar11 = 0;
      uVar7 = (ulong)(uint)tab->symsnum;
      if (tab->symsnum < 1) {
        uVar7 = uVar11;
      }
      lVar5 = 0xc;
      for (; uVar7 != uVar11; uVar11 = uVar11 + 1) {
        uVar10 = *(uint *)((long)tab->syms + lVar5 + -4) % uVar9;
        *(int *)((long)&tab->syms->name + lVar5) = piVar6[(int)uVar10];
        piVar6[(int)uVar10] = (int)uVar11;
        lVar5 = lVar5 + 0x18;
      }
    }
  }
  else {
    iVar3 = -1;
  }
  return iVar3;
}

Assistant:

int symtab_put(struct symtab *tab, const char *cname, int type, int data) {
	if (symtab_get(tab, cname, 0, 0) != -1)
		return -1;
	char *name = strdup(cname);
	struct symtab_sym sym;
	uint32_t hash = elf_hash(name);
	int bucket = hash % tab->bucketsnum;
	int res = tab->symsnum;
	sym.name = name;
	sym.type = type;
	sym.data = data;
	sym.hash = hash;
	sym.hchain = tab->buckets[bucket];
	tab->buckets[bucket] = res;
	ADDARRAY(tab->syms, sym);
	if (tab->symsnum > tab->bucketsnum && tab->bucketsnum != primes[numprimes-1]) {
		/* rehash */
		int i;
		free(tab->buckets);
		for (i = 0; i < numprimes-1; i++)
			if (tab->symsnum <= primes[i])
				break;
		tab->bucketsnum = primes[i];
		tab->buckets = malloc(tab->bucketsnum * sizeof *tab->buckets);
		for (i = 0; i < tab->bucketsnum; i++)
			tab->buckets[i] = -1;
		for (i = 0; i < tab->symsnum; i++) {
			bucket = tab->syms[i].hash % tab->bucketsnum;
			tab->syms[i].hchain = tab->buckets[bucket];
			tab->buckets[bucket] = i;
		}
	}
	return res;
}